

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall tetgenmesh::recoversubfaces(tetgenmesh *this,arraypool *misshlist,int steinerflag)

{
  tetrahedron *pppdVar1;
  uint *puVar2;
  arraypool *paVar3;
  shellface ppdVar4;
  memorypool *pmVar5;
  bool bVar6;
  byte bVar7;
  point pdVar8;
  int i;
  int iVar9;
  int iVar10;
  long lVar11;
  tetrahedron ppdVar12;
  ulong uVar13;
  shellface *pppdVar14;
  ulong uVar15;
  tetrahedron *pppdVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  tetrahedron *pppdVar21;
  shellface ppdVar22;
  face searchsh;
  point steinerpt;
  insertvertexflags ivf;
  face bdsegs [3];
  triface local_118;
  face local_108;
  point local_f8;
  int local_ec;
  arraypool *local_e8;
  tetgenmesh *local_e0;
  insertvertexflags local_d8;
  face afStack_68 [3];
  
  local_118.tet = (tetrahedron *)0x0;
  local_118.ver = 0;
  local_108.sh = (shellface *)0x0;
  local_108.shver = 0;
  lVar11 = 8;
  do {
    *(undefined8 *)((long)afStack_68 + lVar11 + -8) = 0;
    *(undefined4 *)((long)&afStack_68[0].sh + lVar11) = 0;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x38);
  local_d8.refinetet.tet = (tetrahedron *)0x0;
  local_d8.refinetet.ver = 0;
  local_d8.refinesh.sh = (shellface *)0x0;
  local_d8.refinesh.shver = 0;
  local_d8.smlenflag = 0;
  local_d8.smlen = 0.0;
  local_d8.iloc = 0;
  local_d8.bowywat = 0;
  local_d8.lawson = 0;
  local_d8.splitbdflag = 0;
  local_d8.validflag = 0;
  local_d8.respectbdflag = 0;
  local_d8.rejflag = 0;
  local_d8.chkencflag = 0;
  local_d8.cdtflag = 0;
  local_d8.assignmeshsize = 0;
  local_d8.sloc = 0;
  local_d8.sbowywat = 0;
  local_d8.refineflag = 0;
  local_ec = steinerflag;
  local_e8 = misshlist;
  if (1 < this->b->verbose) {
    uVar20 = this->b->fliplinklevel;
    if ((int)uVar20 < 1) {
      pcVar17 = "auto";
      uVar20 = this->autofliplinklevel;
    }
    else {
      pcVar17 = "fixed";
    }
    printf("    Recover subfaces [%s level = %2d] #:  %ld.\n",pcVar17,(ulong)uVar20,
           this->subfacstack->objects);
  }
  paVar3 = this->subfacstack;
  lVar11 = paVar3->objects;
  local_e0 = this;
joined_r0x00138879:
  if (lVar11 < 1) {
    return 0;
  }
  uVar13 = lVar11 - 1;
  paVar3->objects = uVar13;
  lVar11 = (long)paVar3->objectbytes * ((long)paVar3->objectsperblockmark & uVar13);
  local_108.sh = *(shellface **)
                  (paVar3->toparray[(long)uVar13 >> ((byte)paVar3->log2objectsperblock & 0x3f)] +
                  lVar11);
  local_108.shver =
       *(int *)(paVar3->toparray[(long)uVar13 >> ((byte)paVar3->log2objectsperblock & 0x3f)] +
               lVar11 + 8);
  if ((local_108.sh[3] != (shellface)0x0) &&
     (local_108.sh[(ulong)(local_108.shver & 1) + 9] < (shellface)0x10)) {
    if (2 < this->b->verbose) {
      lVar11 = (long)this->pointmarkindex;
      printf("      Recover subface (%d, %d, %d).\n",
             (ulong)*(uint *)((long)local_108.sh[sorgpivot[local_108.shver]] + lVar11 * 4),
             (ulong)*(uint *)((long)local_108.sh[sdestpivot[local_108.shver]] + lVar11 * 4),
             (ulong)*(uint *)((long)local_108.sh[sapexpivot[local_108.shver]] + lVar11 * 4));
    }
    uVar13 = 0;
LAB_0013893b:
    ppdVar4 = local_108.sh[(long)(local_108.shver >> 1) + 6];
    afStack_68[uVar13].shver = (uint)ppdVar4 & 7;
    pppdVar14 = (shellface *)((ulong)ppdVar4 & 0xfffffffffffffff8);
    afStack_68[uVar13].sh = pppdVar14;
    if (pppdVar14 == (shellface *)0x0) {
      ppdVar4 = local_108.sh[sorgpivot[local_108.shver]];
      ppdVar22 = local_108.sh[sdestpivot[local_108.shver]];
      local_118.tet = (tetrahedron *)((ulong)ppdVar4[this->point2simindex] & 0xfffffffffffffff0);
      if (local_118.tet[4] == ppdVar4) {
        local_118.ver = 0xb;
      }
      else if (local_118.tet[5] == ppdVar4) {
        local_118.ver = 3;
      }
      else {
        local_118.ver = 0;
        if (local_118.tet[6] == ppdVar4) {
          local_118.ver = 7;
        }
      }
      finddirection(this,&local_118,(point)ppdVar22);
      if (((local_118.tet[destpivot[local_118.ver]] == ppdVar22) ||
          (iVar10 = recoveredgebyflips(this,(point)ppdVar4,(point)ppdVar22,&local_108,&local_118,0),
          iVar10 != 0)) ||
         (iVar10 = recoveredgebyflips(this,(point)ppdVar22,(point)ppdVar4,&local_108,&local_118,0),
         iVar10 != 0)) {
        makeshellface(this,this->subsegs,afStack_68 + uVar13);
        pppdVar16 = local_118.tet;
        pppdVar14 = afStack_68[uVar13].sh;
        uVar19 = (ulong)afStack_68[uVar13].shver;
        pppdVar14[sorgpivot[uVar19]] = ppdVar4;
        pppdVar14[sdestpivot[uVar19]] = ppdVar22;
        pppdVar14[sapexpivot[uVar19]] = (shellface)0x0;
        puVar2 = (uint *)((long)pppdVar14 + (long)this->shmarkindex * 4 + 4);
        *puVar2 = *puVar2 | 4;
        ppdVar22 = (shellface)(uVar19 | (ulong)pppdVar14);
        local_108.sh[(long)(local_108.shver >> 1) + 6] = ppdVar22;
        *pppdVar14 = (shellface)((long)local_108.shver | (ulong)local_108.sh);
        ppdVar4 = local_108.sh[local_108.shver >> 1];
        if (((ulong)ppdVar4 & 0xfffffffffffffff8) != 0) {
          *(shellface *)
           (((ulong)ppdVar4 & 0xfffffffffffffff8) + 0x30 + (ulong)((uint)ppdVar4 & 6) * 4) =
               ppdVar22;
          *pppdVar14 = ppdVar4;
        }
        uVar19 = (ulong)local_118.ver;
        pppdVar14[9] = (shellface)(uVar19 | (ulong)local_118.tet);
        pppdVar21 = local_118.tet;
        do {
          if (pppdVar21[8] == (tetrahedron)0x0) {
            ppdVar12 = (tetrahedron)memorypool::alloc(local_e0->tet2segpool);
            pppdVar21[8] = ppdVar12;
            lVar11 = 0;
            do {
              pppdVar21[8][lVar11] = (double *)0x0;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 6);
          }
          iVar10 = (int)uVar19;
          pppdVar21[8][ver2edge[iVar10]] = (double *)ppdVar22;
          pppdVar1 = pppdVar21 + facepivot1[iVar10];
          pppdVar21 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
          uVar19 = (ulong)(uint)facepivot2[iVar10][(uint)*pppdVar1 & 0xf];
        } while (pppdVar16 != pppdVar21);
        goto LAB_00138ba2;
      }
      if (uVar13 != 0) {
        iVar10 = this->shmarkindex;
        uVar19 = uVar13;
        do {
          uVar15 = uVar19 - 1 & 0xffffffff;
          pppdVar14 = afStack_68[uVar15].sh;
          if ((*(byte *)((long)pppdVar14 + (long)iVar10 * 4 + 4) & 4) != 0) {
            uVar18 = (ulong)pppdVar14[afStack_68[uVar15].shver >> 1] & 0xfffffffffffffff8;
            uVar15 = (ulong)((uint)pppdVar14[afStack_68[uVar15].shver >> 1] & 6);
            *(undefined8 *)(uVar18 + 0x30 + uVar15 * 4) = 0;
            uVar15 = *(ulong *)(uVar18 + uVar15 * 4);
            uVar18 = uVar15 & 0xfffffffffffffff8;
            if (uVar18 != 0) {
              *(undefined8 *)(uVar18 + 0x30 + (ulong)((uint)uVar15 & 6) * 4) = 0;
            }
            local_118.ver = (uint)pppdVar14[9] & 0xf;
            local_118.tet = (tetrahedron *)((ulong)pppdVar14[9] & 0xfffffffffffffff0);
            pppdVar16 = local_118.tet;
            uVar20 = local_118.ver;
            do {
              if (pppdVar16[8] != (tetrahedron)0x0) {
                pppdVar16[8][ver2edge[(int)uVar20]] = (double *)0x0;
              }
              pppdVar21 = pppdVar16 + facepivot1[(int)uVar20];
              pppdVar16 = (tetrahedron *)((ulong)*pppdVar21 & 0xfffffffffffffff0);
              uVar20 = facepivot2[(int)uVar20][(uint)*pppdVar21 & 0xf];
            } while (pppdVar16 != local_118.tet);
            pmVar5 = this->subsegs;
            pppdVar14[3] = (shellface)0x0;
            *pppdVar14 = (shellface)pmVar5->deaditemstack;
            pmVar5->deaditemstack = pppdVar14;
            pmVar5->items = pmVar5->items + -1;
          }
          bVar6 = 1 < (long)uVar19;
          uVar19 = uVar19 - 1;
        } while (bVar6);
      }
      if (local_ec != 0) {
        if (2 < this->b->verbose) {
          printf("      Add a Steiner point in subedge (%d, %d).\n",
                 (ulong)*(uint *)((long)ppdVar4 + (long)this->pointmarkindex * 4),
                 (ulong)*(uint *)((long)ppdVar22 + (long)this->pointmarkindex * 4));
        }
        makepoint(this,&local_f8,FREEFACETVERTEX);
        pdVar8 = local_f8;
        lVar11 = 0;
        do {
          local_f8[lVar11] = ((double)ppdVar4[lVar11] + (double)ppdVar22[lVar11]) * 0.5;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        local_118.tet = (tetrahedron *)((ulong)ppdVar4[this->point2simindex] & 0xfffffffffffffff0);
        if (local_118.tet[4] == ppdVar4) {
          local_118.ver = 0xb;
        }
        else if (local_118.tet[5] == ppdVar4) {
          local_118.ver = 3;
        }
        else {
          local_118.ver = 0;
          if (local_118.tet[6] == ppdVar4) {
            local_118.ver = 7;
          }
        }
        local_d8.iloc = 1;
        local_d8.bowywat = 1;
        local_d8.lawson = 0;
        local_d8.chkencflag = 0;
        local_d8.sloc = 4;
        local_d8.sbowywat = 1;
        local_d8.splitbdflag = 0;
        local_d8.validflag = 1;
        local_d8.respectbdflag = 1;
        local_d8.rejflag = 0;
        local_d8.assignmeshsize = this->b->metric;
        iVar10 = insertpoint(this,local_f8,&local_118,&local_108,(face *)0x0,&local_d8);
        if (iVar10 == 0) goto LAB_00139337;
        paVar3 = this->subvertstack;
        pcVar17 = arraypool::getblock(paVar3,(int)paVar3->objects);
        uVar19 = paVar3->objects;
        paVar3->objects = uVar19 + 1;
        *(point *)(pcVar17 +
                  (long)paVar3->objectbytes * ((long)paVar3->objectsperblock - 1U & uVar19)) =
             pdVar8;
        this->st_facref_count = this->st_facref_count + 1;
        if (0 < this->steinerleft) {
          this->steinerleft = this->steinerleft + -1;
        }
      }
      goto LAB_00138bcc;
    }
    local_118.ver = (uint)pppdVar14[9] & 0xf;
    local_118.tet = (tetrahedron *)((ulong)pppdVar14[9] & 0xfffffffffffffff0);
    if (local_118.tet != (tetrahedron *)0x0) goto LAB_00138ba2;
    local_118.tet = (tetrahedron *)0x0;
    goto LAB_00139337;
  }
  goto LAB_00138eae;
LAB_00138ba2:
  local_108.shver = snextpivot[local_108.shver];
  uVar13 = uVar13 + 1;
  this = local_e0;
  if (uVar13 == 3) goto code_r0x00138bc7;
  goto LAB_0013893b;
code_r0x00138bc7:
  uVar13 = 3;
LAB_00138bcc:
  bVar7 = 1;
  if ((int)uVar13 == 3) {
    lVar11 = (long)local_108.shver;
    ppdVar12 = local_108.sh[sorgpivot[lVar11]];
    ppdVar4 = local_108.sh[sdestpivot[lVar11]];
    ppdVar22 = local_108.sh[sapexpivot[lVar11]];
    iVar9 = recoverfacebyflips(this,(point)ppdVar12,(point)ppdVar4,(point)ppdVar22,&local_108,
                               &local_118);
    pppdVar16 = local_118.tet;
    iVar10 = this->shmarkindex;
    lVar11 = 0;
    do {
      pppdVar14 = afStack_68[lVar11].sh;
      if ((*(byte *)((long)pppdVar14 + (long)iVar10 * 4 + 4) & 4) != 0) {
        uVar19 = (ulong)pppdVar14[afStack_68[lVar11].shver >> 1] & 0xfffffffffffffff8;
        uVar13 = (ulong)((uint)pppdVar14[afStack_68[lVar11].shver >> 1] & 6);
        *(undefined8 *)(uVar19 + 0x30 + uVar13 * 4) = 0;
        uVar13 = *(ulong *)(uVar19 + uVar13 * 4);
        uVar19 = uVar13 & 0xfffffffffffffff8;
        if (uVar19 != 0) {
          *(undefined8 *)(uVar19 + 0x30 + (ulong)((uint)uVar13 & 6) * 4) = 0;
        }
        uVar20 = (uint)pppdVar14[9] & 0xf;
        uVar19 = (ulong)pppdVar14[9] & 0xfffffffffffffff0;
        uVar13 = uVar19;
        do {
          if (*(long *)(uVar13 + 0x40) != 0) {
            *(undefined8 *)(*(long *)(uVar13 + 0x40) + (long)ver2edge[(int)uVar20] * 8) = 0;
          }
          uVar15 = *(ulong *)(uVar13 + (long)facepivot1[(int)uVar20] * 8);
          uVar13 = uVar15 & 0xfffffffffffffff0;
          uVar20 = facepivot2[(int)uVar20][(uint)uVar15 & 0xf];
        } while (uVar13 != uVar19);
        pmVar5 = this->subsegs;
        pppdVar14[3] = (shellface)0x0;
        *pppdVar14 = (shellface)pmVar5->deaditemstack;
        pmVar5->deaditemstack = pppdVar14;
        pmVar5->items = pmVar5->items + -1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    if (iVar9 == 0) {
      if (local_ec != 0) {
        if (2 < this->b->verbose) {
          printf("      Add a Steiner point in subface (%d, %d, %d).\n",
                 (ulong)*(uint *)((long)ppdVar12 + (long)this->pointmarkindex * 4),
                 (ulong)*(uint *)((long)ppdVar4 + (long)this->pointmarkindex * 4));
        }
        makepoint(this,&local_f8,FREEFACETVERTEX);
        pdVar8 = local_f8;
        lVar11 = 0;
        do {
          local_f8[lVar11] =
               ((double)ppdVar12[lVar11] + (double)ppdVar4[lVar11] + (double)ppdVar22[lVar11]) / 3.0
          ;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        local_118.tet = (tetrahedron *)((ulong)ppdVar12[this->point2simindex] & 0xfffffffffffffff0);
        if (local_118.tet[4] == ppdVar12) {
          local_118.ver = 0xb;
        }
        else if (local_118.tet[5] == ppdVar12) {
          local_118.ver = 3;
        }
        else {
          local_118.ver = 0;
          if (local_118.tet[6] == ppdVar12) {
            local_118.ver = 7;
          }
        }
        local_d8.iloc = 1;
        local_d8.bowywat = 1;
        local_d8.lawson = 0;
        local_d8.chkencflag = 0;
        local_d8.sloc = 3;
        local_d8.sbowywat = 1;
        local_d8.splitbdflag = 0;
        local_d8.validflag = 1;
        local_d8.respectbdflag = 1;
        local_d8.rejflag = 0;
        local_d8.assignmeshsize = this->b->metric;
        iVar10 = insertpoint(this,local_f8,&local_118,&local_108,(face *)0x0,&local_d8);
        if (iVar10 == 0) {
LAB_00139337:
          puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
          puts("  the message above, your input data set, and the exact");
          puts("  command line you used to run this program, thank you.");
          exit(2);
        }
        paVar3 = this->subvertstack;
        pcVar17 = arraypool::getblock(paVar3,(int)paVar3->objects);
        uVar13 = paVar3->objects;
        paVar3->objects = uVar13 + 1;
        *(point *)(pcVar17 +
                  (long)paVar3->objectbytes * ((long)paVar3->objectsperblock - 1U & uVar13)) =
             pdVar8;
        this->st_facref_count = this->st_facref_count + 1;
        if (0 < this->steinerleft) {
          this->steinerleft = this->steinerleft + -1;
        }
      }
    }
    else {
      if (local_108.sh != (shellface *)0x0) {
        if (local_118.tet[9] == (tetrahedron)0x0) {
          ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2subpool);
          pppdVar16[9] = ppdVar12;
          lVar11 = 0;
          do {
            pppdVar16[9][lVar11] = (double *)0x0;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
        }
        lVar11 = (long)local_118.ver;
        uVar13 = (ulong)((local_118.ver & 3U) << 3);
        *(ulong *)((long)pppdVar16[9] + uVar13) =
             (long)tsbondtbl[lVar11][local_108.shver] | (ulong)local_108.sh;
        local_108.sh[(ulong)(local_108.shver & 1) + 9] =
             (shellface)((long)stbondtbl[lVar11][local_108.shver] | (ulong)pppdVar16);
        uVar13 = *(ulong *)((long)pppdVar16 + uVar13);
        pppdVar16 = (tetrahedron *)(uVar13 & 0xfffffffffffffff0);
        uVar20 = fsymtbl[lVar11][(uint)uVar13 & 0xf];
        local_108.shver = local_108.shver ^ 1;
        local_118.tet = pppdVar16;
        local_118.ver = uVar20;
        if (pppdVar16[9] == (tetrahedron)0x0) {
          ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2subpool);
          pppdVar16[9] = ppdVar12;
          lVar11 = 0;
          do {
            pppdVar16[9][lVar11] = (double *)0x0;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
        }
        pppdVar16[9][uVar20 & 3] =
             (double *)((long)tsbondtbl[(int)uVar20][local_108.shver] | (ulong)local_108.sh);
        local_108.sh[(ulong)(local_108.shver & 1) + 9] =
             (shellface)((long)stbondtbl[(int)uVar20][local_108.shver] | (ulong)pppdVar16);
      }
      bVar7 = 0;
    }
  }
  paVar3 = local_e8;
  if (!(bool)(bVar7 ^ 1 | local_e8 == (arraypool *)0x0)) {
    pcVar17 = arraypool::getblock(local_e8,(int)local_e8->objects);
    lVar11 = (long)paVar3->objectbytes * ((long)paVar3->objectsperblock - 1U & paVar3->objects);
    paVar3->objects = paVar3->objects + 1;
    *(shellface **)(pcVar17 + lVar11) = local_108.sh;
    *(int *)(pcVar17 + lVar11 + 8) = local_108.shver;
  }
LAB_00138eae:
  paVar3 = this->subfacstack;
  lVar11 = paVar3->objects;
  goto joined_r0x00138879;
}

Assistant:

int tetgenmesh::recoversubfaces(arraypool *misshlist, int steinerflag)
{
  triface searchtet, neightet, spintet;
  face searchsh, neighsh, neineish, *parysh;
  face bdsegs[3];
  point startpt, endpt, apexpt, *parypt;
  point steinerpt;
  insertvertexflags ivf;
  int success;
  int t1ver;
  int i, j;

  if (b->verbose > 1) {
    printf("    Recover subfaces [%s level = %2d] #:  %ld.\n",
           (b->fliplinklevel > 0) ? "fixed" : "auto",
           (b->fliplinklevel > 0) ? b->fliplinklevel : autofliplinklevel,
           subfacstack->objects);
  }

  // Loop until 'subfacstack' is empty.
  while (subfacstack->objects > 0l) {

    subfacstack->objects--;
    parysh = (face *) fastlookup(subfacstack, subfacstack->objects);
    searchsh = *parysh;

    if (searchsh.sh[3] == NULL) continue; // Skip a dead subface.

    stpivot(searchsh, neightet);
    if (neightet.tet != NULL) continue; // Skip a recovered subface.


    if (b->verbose > 2) {
      printf("      Recover subface (%d, %d, %d).\n",pointmark(sorg(searchsh)),
             pointmark(sdest(searchsh)), pointmark(sapex(searchsh)));
    }

    // The three edges of the face need to be existed first.
    for (i = 0; i < 3; i++) {
      sspivot(searchsh, bdsegs[i]);   
      if (bdsegs[i].sh != NULL) {
        // The segment must exist.
        sstpivot1(bdsegs[i], searchtet);
        if (searchtet.tet == NULL) {
          terminatetetgen(this, 2);
        }
      } else {
        // This edge is not a segment (due to a Steiner point).
        // Check whether it exists or not.
        success = 0;
        startpt = sorg(searchsh);
        endpt = sdest(searchsh);
        point2tetorg(startpt, searchtet);
        finddirection(&searchtet, endpt);
        if (dest(searchtet) == endpt) {
          success = 1;
        } else {
          // The edge is missing. Try to recover it.
          if (recoveredgebyflips(startpt, endpt, &searchsh, &searchtet, 0)) {
            success = 1;
          } else {
            if (recoveredgebyflips(endpt, startpt, &searchsh, &searchtet, 0)) {
              success = 1;
            }
          }
        }
        if (success) {
          // Insert a temporary segment to protect this edge.
          makeshellface(subsegs, &(bdsegs[i]));
          setshvertices(bdsegs[i], startpt, endpt, NULL);
          smarktest2(bdsegs[i]); // It's a temporary segment.
          // Insert this segment into surface mesh.
          ssbond(searchsh, bdsegs[i]);
          spivot(searchsh, neighsh);
          if (neighsh.sh != NULL) {
            ssbond(neighsh, bdsegs[i]);
          }
          // Insert this segment into tetrahedralization.
          sstbond1(bdsegs[i], searchtet);
          // Bond the segment to all tets containing it.
          spintet = searchtet;
          do {
            tssbond1(spintet, bdsegs[i]);
            fnextself(spintet);
          } while (spintet.tet != searchtet.tet);
        } else {
          // An edge of this subface is missing. Can't recover this subface.
          // Delete any temporary segment that has been created.
          for (j = (i - 1); j >= 0; j--) {
            if (smarktest2ed(bdsegs[j])) { 
              spivot(bdsegs[j], neineish);
                ssdissolve(neineish);
                spivot(neineish, neighsh);
                if (neighsh.sh != NULL) {
                  ssdissolve(neighsh);
                }
              sstpivot1(bdsegs[j], searchtet);
                spintet = searchtet;
                while (1) {
                  tssdissolve1(spintet);
                  fnextself(spintet);
                  if (spintet.tet == searchtet.tet) break;
                }
              shellfacedealloc(subsegs, bdsegs[j].sh);
            }
          } // j
          if (steinerflag) {
            // Add a Steiner point at the midpoint of this edge.
            if (b->verbose > 2) {
              printf("      Add a Steiner point in subedge (%d, %d).\n",
                     pointmark(startpt), pointmark(endpt));
            }
            makepoint(&steinerpt, FREEFACETVERTEX);
            for (j = 0; j < 3; j++) {
              steinerpt[j] = 0.5 * (startpt[j] + endpt[j]);
            }

            point2tetorg(startpt, searchtet); // Start from 'searchtet'.
            ivf.iloc = (int) OUTSIDE; // Need point location.
            ivf.bowywat = 1;
            ivf.lawson = 0;
            ivf.rejflag = 0;
            ivf.chkencflag = 0;
            ivf.sloc = (int) ONEDGE;            
            ivf.sbowywat = 1; // Allow flips in facet.
            ivf.splitbdflag = 0;
            ivf.validflag = 1;
            ivf.respectbdflag = 1;
            ivf.assignmeshsize = b->metric;
            if (!insertpoint(steinerpt, &searchtet, &searchsh, NULL, &ivf)) {
              terminatetetgen(this, 2);
            }
            // Save this Steiner point (for removal).
            //   Re-use the array 'subvertstack'.
            subvertstack->newindex((void **) &parypt);
            *parypt = steinerpt;

            st_facref_count++;
            if (steinerleft > 0) steinerleft--;
          } // if (steinerflag)
          break;
        }
      }
      senextself(searchsh);
    } // i

    if (i == 3) {
      // Recover the subface.
      startpt = sorg(searchsh);
      endpt   = sdest(searchsh);
      apexpt  = sapex(searchsh);

      success = recoverfacebyflips(startpt,endpt,apexpt,&searchsh,&searchtet);

      // Delete any temporary segment that has been created.
      for (j = 0; j < 3; j++) {
        if (smarktest2ed(bdsegs[j])) { 
          spivot(bdsegs[j], neineish);
            ssdissolve(neineish);
            spivot(neineish, neighsh);
            if (neighsh.sh != NULL) {
              ssdissolve(neighsh);
            }
          sstpivot1(bdsegs[j], neightet);
            spintet = neightet;
            while (1) {
              tssdissolve1(spintet);
              fnextself(spintet);
              if (spintet.tet == neightet.tet) break;
            }
          shellfacedealloc(subsegs, bdsegs[j].sh);
        }
      } // j

      if (success) {
        if (searchsh.sh != NULL) {
          // Face is recovered. Insert it.
          tsbond(searchtet, searchsh);
          fsymself(searchtet);
          sesymself(searchsh);
          tsbond(searchtet, searchsh);
        }
      } else {
        if (steinerflag) {
          // Add a Steiner point at the barycenter of this subface.
          if (b->verbose > 2) {
            printf("      Add a Steiner point in subface (%d, %d, %d).\n",
                   pointmark(startpt), pointmark(endpt), pointmark(apexpt));
          }
          makepoint(&steinerpt, FREEFACETVERTEX);
          for (j = 0; j < 3; j++) {
            steinerpt[j] = (startpt[j] + endpt[j] + apexpt[j]) / 3.0;
          }

          point2tetorg(startpt, searchtet); // Start from 'searchtet'.
          ivf.iloc = (int) OUTSIDE; // Need point location.
          ivf.bowywat = 1;
          ivf.lawson = 0;
          ivf.rejflag = 0;
          ivf.chkencflag = 0;
          ivf.sloc = (int) ONFACE;          
          ivf.sbowywat = 1; // Allow flips in facet.
          ivf.splitbdflag = 0;
          ivf.validflag = 1;
          ivf.respectbdflag = 1;
          ivf.assignmeshsize = b->metric; 
          if (!insertpoint(steinerpt, &searchtet, &searchsh, NULL, &ivf)) {
            terminatetetgen(this, 2);
          }
          // Save this Steiner point (for removal).
          //   Re-use the array 'subvertstack'.
          subvertstack->newindex((void **) &parypt);
          *parypt = steinerpt;

          st_facref_count++;
          if (steinerleft > 0) steinerleft--;
        } // if (steinerflag)
      }
    } else {
      success = 0;      
    }

    if (!success) {
      if (misshlist != NULL) {
        // Save this subface.
        misshlist->newindex((void **) &parysh);
        *parysh = searchsh;
      }
    }

  } // while (subfacstack->objects > 0l)

  return 0;
}